

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

int tryconnect(_glist *x,t_object *src,int nout,t_object *sink,int nin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _glist *p_Var6;
  int *data;
  ulong uVar7;
  int y21;
  int y12;
  int x22;
  int x21;
  int x12;
  int x11;
  int local_f0;
  int y22;
  _glist *local_e8;
  t_object *local_e0;
  _outconnect *local_d8;
  int y11;
  char *tags [2];
  char tag [128];
  
  iVar1 = canconnect(x,src,nout,sink,nin);
  if ((iVar1 != 0) && (local_d8 = obj_connect(src,nout,sink,nin), local_d8 != (_outconnect *)0x0)) {
    local_f0 = x->gl_zoom * 3;
    iVar1 = x->gl_zoom * -7;
    iVar5 = 0;
    x11 = 0;
    x12 = 0;
    x21 = 0;
    x22 = 0;
    y11 = 0;
    y12 = 0;
    y21 = 0;
    y22 = 0;
    tags[0] = tag;
    tags[1] = "cord";
    sprintf(tags[0],"l%lx",local_d8);
    gobj_getrect(&src->te_g,x,&x11,&y11,&x12,&y12);
    gobj_getrect(&sink->te_g,x,&x21,&y21,&x22,&y22);
    iVar2 = obj_noutlets(src);
    local_e0 = sink;
    iVar3 = obj_ninlets(sink);
    iVar4 = 0;
    if (1 < iVar2) {
      iVar4 = (((iVar1 - x11) + x12) * nout) / (iVar2 + -1);
    }
    iVar2 = x11 + local_f0;
    local_e8 = (_glist *)(ulong)(uint)y12;
    p_Var6 = local_e8;
    if (1 < iVar3) {
      uVar7 = (long)(((iVar1 - x21) + x22) * nin) / (long)(iVar3 + -1);
      p_Var6 = (_glist *)(uVar7 & 0xffffffff);
      iVar5 = (int)uVar7;
    }
    iVar3 = x21 + local_f0;
    uVar7 = (ulong)(uint)y21;
    p_Var6 = glist_getcanvas(p_Var6);
    iVar1 = obj_issignaloutlet(src,nout);
    pdgui_vmess((char *)0x0,"crr iiii ri rS",p_Var6,"create","line",(ulong)(uint)(iVar2 + iVar4),
                local_e8,(ulong)(uint)(iVar3 + iVar5),uVar7,"-width",
                (ulong)(uint)(x->gl_zoom << (iVar1 != 0)),"-tags",2,tags);
    iVar1 = canvas_getindex(x,&src->te_g);
    iVar2 = canvas_getindex(x,&local_e0->te_g);
    data = (int *)getbytes(0x10);
    *data = iVar1;
    data[1] = nout;
    data[2] = iVar2;
    data[3] = nin;
    canvas_undo_add(x,UNDO_CONNECT,"connect",data);
    canvas_dirty(x,1.0);
    if (local_d8 != (_outconnect *)0x0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int tryconnect(t_canvas*x, t_object*src, int nout, t_object*sink, int nin)
{
    if(canconnect(x, src, nout, sink, nin))
    {
        t_outconnect *oc = obj_connect(src, nout, sink, nin);
        if(oc)
        {
            int iow = IOWIDTH * x->gl_zoom;
            int iom = IOMIDDLE * x->gl_zoom;
            int x11=0, x12=0, x21=0, x22=0;
            int y11=0, y12=0, y21=0, y22=0;
            int noutlets1, ninlets, lx1, ly1, lx2, ly2;
            char tag[128];
            char*tags[] = {tag, "cord"};
            sprintf(tag, "l%lx", oc);
            gobj_getrect(&src->ob_g, x, &x11, &y11, &x12, &y12);
            gobj_getrect(&sink->ob_g, x, &x21, &y21, &x22, &y22);

            noutlets1 = obj_noutlets(src);
            ninlets = obj_ninlets(sink);

            lx1 = x11 + (noutlets1 > 1 ?
                             ((x12-x11-iow) * nout)/(noutlets1-1) : 0)
                + iom;
            ly1 = y12;
            lx2 = x21 + (ninlets > 1 ?
                             ((x22-x21-iow) * nin)/(ninlets-1) : 0)
                + iom;
            ly2 = y21;
            pdgui_vmess(0, "crr iiii ri rS",
                glist_getcanvas(x), "create", "line",
                lx1,ly1, lx2,ly2,
                "-width", (obj_issignaloutlet(src, nout) ? 2 : 1) * x->gl_zoom,
                "-tags", 2, tags);
            canvas_undo_add(x, UNDO_CONNECT, "connect", canvas_undo_set_connect(x,
                    canvas_getindex(x, &src->ob_g), nout,
                    canvas_getindex(x, &sink->ob_g), nin));
            canvas_dirty(x, 1);
            return 1;
        }
    }
    return 0;
}